

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O1

int memCompare(word *x,word *y,int nVars)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = Kit_TruthWordNum_64bit(nVars);
  uVar4 = (ulong)uVar3;
  do {
    if ((int)uVar4 < 1) {
      return 0;
    }
    lVar1 = uVar4 - 1;
    lVar2 = uVar4 - 1;
    uVar4 = uVar4 - 1;
  } while (x[lVar1] == y[lVar2]);
  return (y[lVar2] < x[lVar1]) - 1 | 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


int memCompare(word* x, word*  y, int nVars)
{
    int i;
    for(i=Kit_TruthWordNum_64bit( nVars )-1;i>=0;i--)
    {
        if(x[i]==y[i])
            continue;
        else if(x[i]>y[i])
            return 1;
        else
            return -1;
    }
    return 0;
}